

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_c7dac::AddInteractionBPM_duplicate_value_2_Test::TestBody
          (AddInteractionBPM_duplicate_value_2_Test *this)

{
  __node_base _Var1;
  Polynomial<uint32_t,_double> polynomial;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  double local_190;
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_188;
  BinaryPolynomialModel<unsigned_int,_double> local_150;
  
  GeneratePolynomialUINT();
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel
            (&local_150,(Polynomial<unsigned_int,_double> *)&local_188,SPIN);
  if (local_188._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var1._M_nxt = local_188._M_before_begin._M_nxt;
    do {
      local_190 = -(double)_Var1._M_nxt[4]._M_nxt;
      cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteraction
                (&local_150,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(_Var1._M_nxt + 1),
                 &local_190,NONE);
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt;
    } while (_Var1._M_nxt != (_Hash_node_base *)0x0);
  }
  StateTestBPMEmpty<unsigned_int>(&local_150);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_150.poly_key_inv_._M_h);
  if (local_150.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_150.poly_key_list_);
  if (local_150.sorted_variables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.sorted_variables_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.sorted_variables_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.sorted_variables_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_150.variables_to_integers_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_150.each_variable_num_._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_150);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_188);
  return;
}

Assistant:

TEST(AddInteractionBPM, duplicate_value_2) {
   
   Polynomial<uint32_t, double> polynomial = GeneratePolynomialUINT();
   
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   for (const auto &it: polynomial) {
      bpm.AddInteraction(it.first, -it.second);
   };
   
   StateTestBPMEmpty(bpm);
}